

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * __thiscall fmt::v6::format_int::format_decimal(format_int *this,unsigned_long_long value)

{
  byte bVar1;
  char *pcVar2;
  long lStack_8;
  
  pcVar2 = this->buffer_ + 0x15;
  for (; 99 < value; value = value / 100) {
    *(undefined2 *)(pcVar2 + -2) =
         *(undefined2 *)(internal::basic_data<void>::digits + (value % 100) * 2);
    pcVar2 = pcVar2 + -2;
  }
  if (value < 10) {
    bVar1 = (byte)value | 0x30;
    lStack_8 = -1;
  }
  else {
    pcVar2[-1] = internal::basic_data<void>::digits[(value * 2 & 0xffffffff) + 1];
    bVar1 = internal::basic_data<void>::digits[value * 2 & 0x1fffffffe];
    lStack_8 = -2;
  }
  pcVar2[lStack_8] = bVar1;
  return pcVar2 + lStack_8;
}

Assistant:

char* format_decimal(unsigned long long value) {
    char* ptr = buffer_ + (buffer_size - 1);  // Parens to workaround MSVC bug.
    while (value >= 100) {
      // Integer division is slow so do it for a group of two digits instead
      // of for every digit. The idea comes from the talk by Alexandrescu
      // "Three Optimization Tips for C++". See speed-test for a comparison.
      auto index = static_cast<unsigned>((value % 100) * 2);
      value /= 100;
      *--ptr = internal::data::digits[index + 1];
      *--ptr = internal::data::digits[index];
    }
    if (value < 10) {
      *--ptr = static_cast<char>('0' + value);
      return ptr;
    }
    auto index = static_cast<unsigned>(value * 2);
    *--ptr = internal::data::digits[index + 1];
    *--ptr = internal::data::digits[index];
    return ptr;
  }